

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void cashew::ValueBuilder::appendCodeToSwitch(Ref switch_,Ref code,bool explicitBlock)

{
  bool bVar1;
  Ref *pRVar2;
  Ref RVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  Ref local_40;
  Ref switch__local;
  Ref code_local;
  
  local_40.inst = switch_.inst;
  switch__local = code;
  pRVar2 = Ref::operator[](&local_40,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)SWITCH);
  if (!bVar1) {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6f2,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
  }
  pRVar2 = Ref::operator[](&switch__local,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)BLOCK);
  if (bVar1) {
    if (explicitBlock) {
      pRVar2 = Ref::operator[](&local_40,2);
      RVar3 = cashew::Value::back(pRVar2->inst);
      RVar3 = cashew::Value::back(RVar3.inst);
      cashew::Value::push_back(RVar3.inst,switch__local);
    }
    else {
      uVar5 = 0;
      while( true ) {
        pRVar2 = Ref::operator[](&switch__local,1);
        sVar4 = cashew::Value::size(pRVar2->inst);
        if (sVar4 <= uVar5) break;
        pRVar2 = Ref::operator[](&local_40,2);
        RVar3 = cashew::Value::back(pRVar2->inst);
        RVar3 = cashew::Value::back(RVar3.inst);
        pRVar2 = Ref::operator[](&switch__local,1);
        pRVar2 = Ref::operator[](pRVar2,(uint)uVar5);
        cashew::Value::push_back(RVar3.inst,pRVar2->inst);
        uVar5 = uVar5 + 1;
      }
    }
    return;
  }
  __assert_fail("code[0] == BLOCK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6f3,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
}

Assistant:

static void appendCodeToSwitch(Ref switch_, Ref code, bool explicitBlock) {
    assert(switch_[0] == SWITCH);
    assert(code[0] == BLOCK);
    if (!explicitBlock) {
      for (size_t i = 0; i < code[1]->size(); i++) {
        switch_[2]->back()->back()->push_back(code[1][i]);
      }
    } else {
      switch_[2]->back()->back()->push_back(code);
    }
  }